

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse_number_double(parser *this,token *t)

{
  string *psVar1;
  istream *piVar2;
  reader *this_00;
  json_parser_exception *this_01;
  size_t byte_index;
  token *in_RDX;
  double d;
  istringstream is;
  
  psVar1 = token::get_raw_value_abi_cxx11_(in_RDX);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)psVar1,_S_in);
  piVar2 = std::istream::_M_extract<double>((double *)&is);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    if ((ulong)ABS(d) < 0x7ff0000000000000) {
      this_00 = (reader *)operator_new(0x58);
      json::json((json *)this_00,d);
      this->m_reader = this_00;
      std::__cxx11::istringstream::~istringstream((istringstream *)&is);
      return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
             (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
    }
  }
  this_01 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
  psVar1 = token::get_raw_value_abi_cxx11_(in_RDX);
  byte_index = reader::get_byte_index((reader *)t->_vptr_token);
  json_parser_exception::json_parser_exception(this_01,number_out_of_range_e,psVar1,byte_index);
  __cxa_throw(this_01,&json_parser_exception::typeinfo,std::exception::~exception);
}

Assistant:

unique_ptr<json> parser::parse_number_double(const token &t)
{
    istringstream is(t.get_raw_value());
    double d;

    if (is >> d && isfinite(d))
    {
        return unique_ptr<json>(new json(d));
    }
    else
    {
        // We know the float is syntactically correct so this has to be a range error.
        throw json_parser_exception(
                            json_parser_exception::number_out_of_range_e,
                            t.get_raw_value(),
                            m_reader.get_byte_index());
    }
}